

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ProgramStateDeleteShaderCase::executeForProgram
          (ProgramStateDeleteShaderCase *this,Program *program,ShaderAllocator *shaders)

{
  TestLog *pTVar1;
  mapped_type pSVar2;
  mapped_type *ppSVar3;
  char *__s;
  long *plVar4;
  long *plVar5;
  allocator<char> local_211;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  pTVar1 = ((this->super_ProgramStateCase).super_ApiCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_1b0._0_4_ = (this->super_ProgramStateCase).m_shaderType;
  ppSVar3 = std::
            map<glu::ShaderType,_glu::Shader_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
            ::operator[](&shaders->m_shaders,(key_type *)local_1b0);
  pSVar2 = *ppSVar3;
  local_1b0 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = glu::getShaderTypeName((this->super_ProgramStateCase).m_shaderType);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1d0,__s,&local_211);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0x1bfa9f2);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_1e0 = *plVar5;
    lStack_1d8 = plVar4[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar5;
    local_1f0 = (long *)*plVar4;
  }
  local_1e8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_200 = *plVar5;
    lStack_1f8 = plVar4[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *plVar5;
    local_210 = (long *)*plVar4;
  }
  local_208 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_210,local_208);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  glu::Program::detachShader(program,pSVar2->m_shader);
  Functional::anon_unknown_0::ShaderAllocator::deleteShader
            (shaders,(this->super_ProgramStateCase).m_shaderType);
  return;
}

Assistant:

void executeForProgram (glu::Program& program, ShaderAllocator& shaders)
	{
		TestLog&		log			= m_testCtx.getLog();
		glu::Shader&	caseShader	= shaders.get(m_shaderType);

		log << TestLog::Message << "Deleting " + std::string(getShaderTypeName(m_shaderType)) + " shader" << TestLog::EndMessage;
		program.detachShader(caseShader.getShader());
		shaders.deleteShader(m_shaderType);
	}